

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O0

int VP8LEncodeImage(WebPConfig *config,WebPPicture *picture)

{
  int iVar1;
  WebPAuxStats *__s;
  int iVar2;
  int iVar3;
  int iVar4;
  WebPPicture *in_RSI;
  long in_RDI;
  int mb_h;
  int mb_w;
  WebPAuxStats *stats;
  VP8LBitWriter bw;
  int initial_size;
  int percent;
  size_t coded_size;
  int has_alpha;
  int height;
  int width;
  VP8LBitWriter *in_stack_00000728;
  WebPPicture *in_stack_00000730;
  WebPConfig *in_stack_00000738;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  size_t *in_stack_ffffffffffffffa8;
  VP8LBitWriter *in_stack_ffffffffffffffb0;
  WebPPicture *in_stack_ffffffffffffffb8;
  int local_40;
  int local_30;
  
  if (in_RSI == (WebPPicture *)0x0) {
    return 0;
  }
  if ((in_RDI == 0) || (in_RSI->argb == (uint32_t *)0x0)) {
    iVar2 = WebPEncodingSetError(in_RSI,VP8_ENC_ERROR_NULL_PARAMETER);
    return iVar2;
  }
  iVar2 = in_RSI->width;
  iVar1 = in_RSI->height;
  if (*(int *)(in_RDI + 0xc) == 3) {
    iVar3 = iVar2 * iVar1;
  }
  else {
    iVar3 = iVar2 * iVar1 * 2;
  }
  iVar4 = VP8LBitWriterInit((VP8LBitWriter *)CONCAT44(iVar3,in_stack_ffffffffffffff80),
                            CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  if (iVar4 == 0) {
    WebPEncodingSetError(in_RSI,VP8_ENC_ERROR_OUT_OF_MEMORY);
    goto LAB_001aff27;
  }
  iVar4 = WebPReportProgress((WebPPicture *)
                             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),iVar3,
                             (int *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  if (iVar4 != 0) {
    if (in_RSI->stats != (WebPAuxStats *)0x0) {
      __s = in_RSI->stats;
      memset(__s,0,0xbc);
      __s->PSNR[0] = 99.0;
      __s->PSNR[1] = 99.0;
      __s->PSNR[2] = 99.0;
      __s->PSNR[3] = 99.0;
      __s->PSNR[4] = 99.0;
    }
    iVar4 = WriteImageSize((WebPPicture *)CONCAT44(iVar3,in_stack_ffffffffffffff80),
                           (VP8LBitWriter *)
                           CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (iVar4 == 0) {
      WebPEncodingSetError(in_RSI,VP8_ENC_ERROR_OUT_OF_MEMORY);
      goto LAB_001aff27;
    }
    WebPPictureHasTransparency
              ((WebPPicture *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    iVar4 = WriteRealAlphaAndVersion
                      ((VP8LBitWriter *)CONCAT44(iVar3,in_stack_ffffffffffffff80),
                       in_stack_ffffffffffffff7c);
    if (iVar4 == 0) {
      WebPEncodingSetError(in_RSI,VP8_ENC_ERROR_OUT_OF_MEMORY);
      goto LAB_001aff27;
    }
    iVar4 = WebPReportProgress((WebPPicture *)
                               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),iVar3,
                               (int *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78))
    ;
    if (iVar4 != 0) {
      iVar4 = VP8LEncodeStream(in_stack_00000738,in_stack_00000730,in_stack_00000728);
      if (iVar4 == 0) goto LAB_001aff27;
      iVar4 = WebPReportProgress((WebPPicture *)
                                 CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),iVar3
                                 ,(int *)CONCAT44(in_stack_ffffffffffffff7c,
                                                  in_stack_ffffffffffffff78));
      if (iVar4 != 0) {
        iVar4 = WriteImage(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                           in_stack_ffffffffffffffa8);
        if (iVar4 == 0) goto LAB_001aff27;
        iVar3 = WebPReportProgress((WebPPicture *)
                                   CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                                   iVar3,(int *)CONCAT44(in_stack_ffffffffffffff7c,
                                                         in_stack_ffffffffffffff78));
        if (iVar3 != 0) {
          if (in_RSI->stats != (WebPAuxStats *)0x0) {
            in_RSI->stats->coded_size = local_30 + in_RSI->stats->coded_size;
            in_RSI->stats->lossless_size = local_30;
          }
          if (in_RSI->extra_info != (uint8_t *)0x0) {
            memset(in_RSI->extra_info,0,(long)((iVar2 + 0xf >> 4) * (iVar1 + 0xf >> 4)));
          }
          goto LAB_001aff27;
        }
      }
    }
  }
  WebPEncodingSetError(in_RSI,VP8_ENC_ERROR_USER_ABORT);
LAB_001aff27:
  if (local_40 != 0) {
    WebPEncodingSetError(in_RSI,VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  VP8LBitWriterWipeOut((VP8LBitWriter *)0x1aff47);
  return (uint)(in_RSI->error_code == VP8_ENC_OK);
}

Assistant:

int VP8LEncodeImage(const WebPConfig* const config,
                    const WebPPicture* const picture) {
  int width, height;
  int has_alpha;
  size_t coded_size;
  int percent = 0;
  int initial_size;
  VP8LBitWriter bw;

  if (picture == NULL) return 0;

  if (config == NULL || picture->argb == NULL) {
    return WebPEncodingSetError(picture, VP8_ENC_ERROR_NULL_PARAMETER);
  }

  width = picture->width;
  height = picture->height;
  // Initialize BitWriter with size corresponding to 16 bpp to photo images and
  // 8 bpp for graphical images.
  initial_size = (config->image_hint == WEBP_HINT_GRAPH) ?
      width * height : width * height * 2;
  if (!VP8LBitWriterInit(&bw, initial_size)) {
    WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
    goto Error;
  }

  if (!WebPReportProgress(picture, 1, &percent)) {
 UserAbort:
    WebPEncodingSetError(picture, VP8_ENC_ERROR_USER_ABORT);
    goto Error;
  }
  // Reset stats (for pure lossless coding)
  if (picture->stats != NULL) {
    WebPAuxStats* const stats = picture->stats;
    memset(stats, 0, sizeof(*stats));
    stats->PSNR[0] = 99.f;
    stats->PSNR[1] = 99.f;
    stats->PSNR[2] = 99.f;
    stats->PSNR[3] = 99.f;
    stats->PSNR[4] = 99.f;
  }

  // Write image size.
  if (!WriteImageSize(picture, &bw)) {
    WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
    goto Error;
  }

  has_alpha = WebPPictureHasTransparency(picture);
  // Write the non-trivial Alpha flag and lossless version.
  if (!WriteRealAlphaAndVersion(&bw, has_alpha)) {
    WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
    goto Error;
  }

  if (!WebPReportProgress(picture, 2, &percent)) goto UserAbort;

  // Encode main image stream.
  if (!VP8LEncodeStream(config, picture, &bw)) goto Error;

  if (!WebPReportProgress(picture, 99, &percent)) goto UserAbort;

  // Finish the RIFF chunk.
  if (!WriteImage(picture, &bw, &coded_size)) goto Error;

  if (!WebPReportProgress(picture, 100, &percent)) goto UserAbort;

#if !defined(WEBP_DISABLE_STATS)
  // Save size.
  if (picture->stats != NULL) {
    picture->stats->coded_size += (int)coded_size;
    picture->stats->lossless_size = (int)coded_size;
  }
#endif

  if (picture->extra_info != NULL) {
    const int mb_w = (width + 15) >> 4;
    const int mb_h = (height + 15) >> 4;
    memset(picture->extra_info, 0, mb_w * mb_h * sizeof(*picture->extra_info));
  }

 Error:
  if (bw.error) {
    WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  VP8LBitWriterWipeOut(&bw);
  return (picture->error_code == VP8_ENC_OK);
}